

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_dnscache_add(Curl_easy *data,Curl_dns_entry *entry)

{
  size_t sVar1;
  void *pvVar2;
  CURLcode CVar3;
  size_t in_R8;
  Curl_multi *pCVar4;
  char id [262];
  char acStack_138 [264];
  
  pCVar4 = (Curl_multi *)data->share;
  if (((pCVar4 == (Curl_multi *)0x0) || ((pCVar4->xfers_alive & 8) == 0)) &&
     (pCVar4 = data->multi, pCVar4 == (Curl_multi *)0x0)) {
    CVar3 = CURLE_FAILED_INIT;
  }
  else {
    sVar1 = create_dnscache_id(entry->hostname,0,entry->hostport,acStack_138,in_R8);
    if ((Curl_multi *)data->share == pCVar4) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pvVar2 = Curl_hash_add(&(pCVar4->dnscache).entries,acStack_138,sVar1 + 1,entry);
    if (pvVar2 == (void *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      entry->refcount = entry->refcount + 1;
      CVar3 = CURLE_OK;
    }
    if ((Curl_multi *)data->share == pCVar4) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_dnscache_add(struct Curl_easy *data,
                           struct Curl_dns_entry *entry)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  char id[MAX_HOSTCACHE_LEN];
  size_t idlen;

  if(!dnscache)
    return CURLE_FAILED_INIT;
  /* Create an entry id, based upon the hostname and port */
  idlen = create_dnscache_id(entry->hostname, 0, entry->hostport,
                             id, sizeof(id));

  /* Store the resolved data in our DNS cache and up ref count */
  dnscache_lock(data, dnscache);
  if(!Curl_hash_add(&dnscache->entries, id, idlen + 1, (void *)entry)) {
    dnscache_unlock(data, dnscache);
    return CURLE_OUT_OF_MEMORY;
  }
  entry->refcount++;
  dnscache_unlock(data, dnscache);
  return CURLE_OK;
}